

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::KNearestNeighborsClassifier::MergePartialFromCodedStream
          (KNearestNeighborsClassifier *this,CodedInputStream *input)

{
  DefaultClassLabelUnion *this_00;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint32 uVar8;
  Int64Parameter *this_01;
  unsigned_long uVar9;
  InverseDistanceWeighting *this_02;
  NearestNeighborsIndex *this_03;
  UniformWeighting *this_04;
  undefined8 *puVar10;
  StringVector *this_05;
  Int64Vector *this_06;
  pair<int,_int> pVar11;
  char cVar12;
  ulong uVar13;
  DefaultClassLabelUnion value;
  CodedInputStream *pCVar14;
  pair<unsigned_long,_bool> pVar15;
  
  this_00 = &this->DefaultClassLabel_;
LAB_00454901:
  do {
    puVar10 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar13 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar6 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar8 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
        goto LAB_00454e4a;
        uVar13 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar13 = uVar13 | 0x100000000;
    }
    else {
LAB_00454e4a:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar13 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar8 | uVar13;
    }
    uVar8 = (uint32)uVar13;
    if ((uVar13 & 0x100000000) == 0) goto LAB_0045495e;
    uVar6 = (uint)(uVar13 >> 3) & 0x1fffffff;
    cVar12 = (char)uVar13;
    if (uVar6 < 0x6e) {
      if (uVar6 < 100) {
        if (uVar6 == 1) {
          if (cVar12 == '\n') {
            this_03 = this->nearestneighborsindex_;
            if (this_03 == (NearestNeighborsIndex *)0x0) {
              this_03 = (NearestNeighborsIndex *)operator_new(0x50);
              NearestNeighborsIndex::NearestNeighborsIndex(this_03);
              this->nearestneighborsindex_ = this_03;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar7);
            if ((long)pVar11 < 0) {
              return false;
            }
            bVar5 = NearestNeighborsIndex::MergePartialFromCodedStream(this_03,input);
            goto LAB_00454e2e;
          }
        }
        else if ((uVar6 == 3) && (cVar12 == '\x1a')) {
          this_01 = this->numberofneighbors_;
          if (this_01 == (Int64Parameter *)0x0) {
            this_01 = (Int64Parameter *)operator_new(0x28);
            Int64Parameter::Int64Parameter(this_01);
            this->numberofneighbors_ = this_01;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar7);
          if ((long)pVar11 < 0) {
            return false;
          }
          bVar5 = Int64Parameter::MergePartialFromCodedStream(this_01,input);
          goto LAB_00454e2e;
        }
      }
      else if (uVar6 == 100) {
        if (cVar12 == '\"') {
          if (this->_oneof_case_[0] == 100) {
            this_05 = (this->ClassLabels_).stringclasslabels_;
          }
          else {
            clear_ClassLabels(this);
            this->_oneof_case_[0] = 100;
            this_05 = (StringVector *)operator_new(0x30);
            StringVector::StringVector(this_05);
            (this->ClassLabels_).stringclasslabels_ = this_05;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar7);
          if ((long)pVar11 < 0) {
            return false;
          }
          bVar5 = StringVector::MergePartialFromCodedStream(this_05,input);
          goto LAB_00454e2e;
        }
      }
      else if ((uVar6 == 0x65) && (cVar12 == '*')) {
        if (this->_oneof_case_[0] == 0x65) {
          this_06 = (this->ClassLabels_).int64classlabels_;
        }
        else {
          clear_ClassLabels(this);
          this->_oneof_case_[0] = 0x65;
          this_06 = (Int64Vector *)operator_new(0x28);
          Int64Vector::Int64Vector(this_06);
          (this->ClassLabels_).int64classlabels_ = this_06;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar7);
        if ((long)pVar11 < 0) {
          return false;
        }
        bVar5 = Int64Vector::MergePartialFromCodedStream(this_06,input);
        goto LAB_00454e2e;
      }
      goto LAB_0045495e;
    }
    if (uVar6 < 200) {
      if (uVar6 == 0x6e) {
        if (cVar12 != 'r') goto LAB_0045495e;
        if (this->_oneof_case_[1] == 0x6e) {
          value.defaultstringlabel_.ptr_ = (ArenaStringPtr)this_00->defaultint64label_;
          if ((string *)value.defaultint64label_ ==
              (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
          goto LAB_00454bf9;
        }
        else {
          clear_DefaultClassLabel(this);
          this->_oneof_case_[1] = 0x6e;
          this->DefaultClassLabel_ =
               (DefaultClassLabelUnion)
               &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
LAB_00454bf9:
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (&this_00->defaultstringlabel_,
                     (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          value.defaultstringlabel_.ptr_ = *(ArenaStringPtr *)this_00;
        }
        bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,(string *)value);
        if (!bVar5) {
          return false;
        }
        if (this->_oneof_case_[1] == 0x6e) {
          puVar10 = (undefined8 *)(this->DefaultClassLabel_).defaultint64label_;
        }
        bVar5 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          ((char *)*puVar10,*(int *)(puVar10 + 1),PARSE,
                           "CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel");
        if (!bVar5) {
          return false;
        }
      }
      else {
        if ((uVar6 != 0x6f) || (cVar12 != 'x')) {
LAB_0045495e:
          if (uVar8 == 0) {
            return true;
          }
          if ((uVar8 & 7) == 4) {
            return true;
          }
          bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8);
          goto joined_r0x00454e42;
        }
        clear_DefaultClassLabel(this);
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar9 = (unsigned_long)(char)*puVar4, -1 < (long)uVar9)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          pVar15 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar9 = pVar15.first;
          if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        (this->DefaultClassLabel_).defaultint64label_ = uVar9;
        this->_oneof_case_[1] = 0x6f;
      }
      goto LAB_00454901;
    }
    if (uVar6 == 200) {
      if (cVar12 == 'B') {
        if (this->_oneof_case_[2] != 200) {
          clear_WeightingScheme(this);
          this->_oneof_case_[2] = 200;
          this_04 = (UniformWeighting *)operator_new(0x18);
          UniformWeighting::UniformWeighting(this_04);
          (this->WeightingScheme_).uniformweighting_ = this_04;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pCVar14 = input;
        pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar7);
        if ((long)pVar11 < 0) {
          return false;
        }
        bVar5 = UniformWeighting::MergePartialFromCodedStream((UniformWeighting *)pCVar14,input);
        goto LAB_00454e2e;
      }
      goto LAB_0045495e;
    }
    if ((uVar6 != 0xd2) || (cVar12 != -0x6e)) goto LAB_0045495e;
    if (this->_oneof_case_[2] != 0xd2) {
      clear_WeightingScheme(this);
      this->_oneof_case_[2] = 0xd2;
      this_02 = (InverseDistanceWeighting *)operator_new(0x18);
      InverseDistanceWeighting::InverseDistanceWeighting(this_02);
      (this->WeightingScheme_).inversedistanceweighting_ = this_02;
    }
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
      input->buffer_ = puVar4 + 1;
    }
    else {
      iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (iVar7 < 0) {
        return false;
      }
    }
    pCVar14 = input;
    pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                       (input,iVar7);
    if ((long)pVar11 < 0) {
      return false;
    }
    bVar5 = InverseDistanceWeighting::MergePartialFromCodedStream
                      ((InverseDistanceWeighting *)pCVar14,input);
LAB_00454e2e:
    if (bVar5 == false) {
      return false;
    }
    bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                      (input,pVar11.first);
joined_r0x00454e42:
    if (!bVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool KNearestNeighborsClassifier::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.KNearestNeighborsClassifier)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.NearestNeighborsIndex nearestNeighborsIndex = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_nearestneighborsindex()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Parameter numberOfNeighbors = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_numberofneighbors()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string defaultStringLabel = 110;
      case 110: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(882u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_defaultstringlabel()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->defaultstringlabel().data(), this->defaultstringlabel().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 defaultInt64Label = 111;
      case 111: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(888u)) {
          clear_DefaultClassLabel();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &DefaultClassLabel_.defaultint64label_)));
          set_has_defaultint64label();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.UniformWeighting uniformWeighting = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_uniformweighting()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.InverseDistanceWeighting inverseDistanceWeighting = 210;
      case 210: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1682u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inversedistanceweighting()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.KNearestNeighborsClassifier)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.KNearestNeighborsClassifier)
  return false;
#undef DO_
}